

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.hpp
# Opt level: O2

void __thiscall ui::UI::add_layer(UI *this,string *name,Renderable *r)

{
  layer_t local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  local_40.layer._M_t.super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>.
  _M_t.super__Tuple_impl<0UL,_ui::Renderable_*,_std::default_delete<ui::Renderable>_>.
  super__Head_base<0UL,_ui::Renderable_*,_false>._M_head_impl =
       (__uniq_ptr_data<ui::Renderable,_std::default_delete<ui::Renderable>,_true,_true>)
       (__uniq_ptr_data<ui::Renderable,_std::default_delete<ui::Renderable>,_true,_true>)r;
  std::vector<ui::layer_t,_std::allocator<ui::layer_t>_>::emplace_back<ui::layer_t>
            (&this->_layers,&local_40);
  layer_t::~layer_t(&local_40);
  (*(r->super_Area)._vptr_Area[8])(r,r);
  (*(r->super_Area)._vptr_Area[1])(r);
  (**(r->super_Area)._vptr_Area)(r);
  (*(r->super_Area)._vptr_Area[0xc])(r);
  return;
}

Assistant:

void add_layer(std::string name, Renderable *r) {
            _layers.push_back(layer_t {name, std::unique_ptr<Renderable>(r)});
            r->set_root(r);
            r->recalculate_dimension();
            r->recalculate_origin();
            r->show();
        }